

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O2

TreeNode * anon_unknown.dwarf_eb46::add_exp(void)

{
  TreeNode *pTVar1;
  TreeNode *pTVar2;
  allocator local_49;
  string local_48;
  string local_28;
  
  pTVar1 = newNode(Void,lineno);
  if (pTVar1 != (TreeNode *)0x0) {
    pTVar2 = mul_exp();
    pTVar1->child[0] = pTVar2;
  }
  if ((anonymous_namespace)::token == 0x1b) {
    std::__cxx11::string::string((string *)&local_48,"",&local_49);
    match(TK_SUB,0,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    pTVar1->nodetype = SUB_EXP;
  }
  else {
    if ((anonymous_namespace)::token != 0x1a) {
      return pTVar1->child[0];
    }
    std::__cxx11::string::string((string *)&local_28,"",&local_49);
    match(TK_PLUS,0,&local_28);
    std::__cxx11::string::~string((string *)&local_28);
    pTVar1->nodetype = PLUS_EXP;
  }
  pTVar2 = add_exp();
  pTVar1->child[1] = pTVar2;
  return pTVar1;
}

Assistant:

TreeNode* add_exp(){
        TreeNode *t = newNode(Void, lineno);
        if(t != nullptr){
            t->child[0] = mul_exp();
        }
        switch(token){
            case TK_PLUS:
                match(TK_PLUS);
                t->nodetype = PLUS_EXP;
                t->child[1] = add_exp();
                break;
            case TK_SUB:
                match(TK_SUB);
                t->nodetype = SUB_EXP;
                t->child[1] = add_exp();
                break;
            default:
                t = t->child[0];
                break;
        }
        return t;
    }